

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_common_int.h
# Opt level: O2

void update_partition_context
               (MACROBLOCKD *xd,int mi_row,int mi_col,BLOCK_SIZE subsize,BLOCK_SIZE bsize)

{
  byte bVar1;
  undefined3 in_register_00000009;
  undefined3 in_register_00000081;
  
  bVar1 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
          [CONCAT31(in_register_00000081,bsize)];
  memset(xd->above_partition_context + mi_col,
         (uint)(byte)partition_context_lookup[CONCAT31(in_register_00000009,subsize)].above,
         (ulong)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                [CONCAT31(in_register_00000081,bsize)]);
  memset(xd->left_partition_context + (mi_row & 0x1f),
         (uint)(byte)partition_context_lookup[CONCAT31(in_register_00000009,subsize)].left,
         (ulong)bVar1);
  return;
}

Assistant:

static inline void update_partition_context(MACROBLOCKD *xd, int mi_row,
                                            int mi_col, BLOCK_SIZE subsize,
                                            BLOCK_SIZE bsize) {
  PARTITION_CONTEXT *const above_ctx = xd->above_partition_context + mi_col;
  PARTITION_CONTEXT *const left_ctx =
      xd->left_partition_context + (mi_row & MAX_MIB_MASK);

  const int bw = mi_size_wide[bsize];
  const int bh = mi_size_high[bsize];
  memset(above_ctx, partition_context_lookup[subsize].above, bw);
  memset(left_ctx, partition_context_lookup[subsize].left, bh);
}